

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf.cpp
# Opt level: O2

void __thiscall ins_ekf::InsEkf::Predict(InsEkf *this,double dt)

{
  Matrix<double,_3,_1,_0,_3,_1> *matrix;
  double dVar1;
  InsEkf *pIVar2;
  Vector3d *pVVar3;
  Scalar *pSVar4;
  Matrix<double,_15,_15,_0,_15,_15> *this_00;
  int i;
  long row;
  Matrix3d *local_1c58;
  Matrix<double,_3,_1,_0,_3,_1> *local_1c50;
  double dt_local;
  Matrix3d *local_1c40;
  StorageBaseType *local_1c38;
  InsEkf *local_1c30;
  double local_1c28;
  undefined1 local_1c20 [16];
  scalar_constant_op<double> local_1c10;
  RhsNested local_1c08;
  Vector3d *local_1bf8;
  Matrix3d *local_1bf0;
  double angle_rate;
  undefined1 local_1be0 [16];
  RhsNested local_1bd0;
  RhsNested local_1bc8;
  Matrix3d R_ItoB_hat;
  Vector3d a_est;
  Matrix3d d_w_skew_d_biasGr;
  Vector3d w_est;
  Matrix3d d_w_skew_d_biasGq;
  Matrix3d d_w_skew_d_biasGp;
  Matrix3d w_ss;
  Matrix3d R_pert;
  Matrix3d Jr;
  Matrix<double,_15,_15,_0,_15,_15> GQG;
  Matrix<double,_12,_12,_0,_12,_12> Qd;
  Matrix4d theta;
  Matrix4d omega;
  Matrix<double,_15,_12,_0,_15,_12> Gk;
  Matrix<double,_15,_15,_0,_15,_15> Phi_k;
  
  dt_local = dt;
  local_1c30 = (InsEkf *)dt;
  Eigen::VectorBlock<Eigen::Matrix<double,_11,_1,_0,_11,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1> *)&GQG,
             &this->last_measurements_,0,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,-1,1,false>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)&Phi_k,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,_1,1,false>> *)&GQG,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&this->bias_g_);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,_1,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&w_est,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&Phi_k);
  Eigen::VectorBlock<Eigen::Matrix<double,_11,_1,_0,_11,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1> *)&GQG,
             &this->last_measurements_,3,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,-1,1,false>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)&Phi_k,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,_1,1,false>> *)&GQG,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&this->bias_a_);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,_1,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&a_est,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&Phi_k);
  SkewSymmetric((Matrix3d *)&Phi_k,&w_est);
  SkewSymmetric((Matrix3d *)&GQG,&w_est);
  local_1bf8 = &this->imu_offset_;
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[0] =
       (double)&Phi_k;
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[1] =
       (double)&GQG;
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[2] =
       (double)local_1bf8;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-=
            ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&a_est,
             (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&Gk);
  SkewSymmetric(&w_ss,&w_est);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
            ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)&omega,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              *)&Phi_k);
  GQG.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[0] =
       (double)&w_ss;
  Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&Phi_k,
             (Matrix<double,_4,_4,_0,_4,_4> *)&omega,0,0,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&Phi_k,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
              *)&GQG);
  Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&Phi_k,
             (Matrix<double,_4,_4,_0,_4,_4> *)&omega,0,3,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&Phi_k,&w_est);
  GQG.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[0] =
       (double)&w_est;
  Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&Phi_k,
             (Matrix<double,_4,_4,_0,_4,_4> *)&omega,3,0,1,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>const>>
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)&Phi_k,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&GQG);
  local_1c50 = (Matrix<double,_3,_1,_0,_3,_1> *)
               SQRT(w_est.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[2] *
                    w_est.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[2] +
                    w_est.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[1] *
                    w_est.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[1] +
                    w_est.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[0] *
                    w_est.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[0]);
  angle_rate = (double)local_1c50;
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[0] =
       (double)local_1c30 * 0.5;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
                    *)&GQG,(double *)&Gk,(StorageBaseType *)&omega);
  Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[3] =
       GQG.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array
       [2];
  Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[4] =
       GQG.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array
       [3];
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,4,0,4,4>const>const,Eigen::Matrix<double,4,4,0,4,4>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)&theta,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>_>
              *)&Phi_k);
  if (1e-10 < (double)local_1c50) {
    local_1c30 = (InsEkf *)((double)local_1c50 * 0.5 * dt_local);
    Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[0] =
         cos((double)local_1c30);
    Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                      *)&Gk,(double *)&Qd,(StorageBaseType *)&R_ItoB_hat);
    local_1c50 = (Matrix<double,_3,_1,_0,_3,_1> *)(1.0 / (double)local_1c50);
    dVar1 = sin((double)local_1c30);
    R_pert.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
         dVar1 * (double)local_1c50;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
                      *)&GQG,(double *)&R_pert,(StorageBaseType *)&omega);
    Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[3]
         = Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.
           array[2];
    Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[7]
         = GQG.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.
           array[2];
    Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[8]
         = GQG.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.
           array[3];
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,4,4,0,4,4>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,4,0,4,4>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,4,4,0,4,4>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,4,0,4,4>const>const,Eigen::Matrix<double,4,4,0,4,4>const>const>>
              (&theta,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                       *)&Phi_k);
  }
  Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[0] =
       (double)&theta;
  Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[1] =
       (double)this;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,1,0,4,1>,0>>
            (&this->orientation_,
             (Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>
              *)&Phi_k);
  QuatToRPY((Vector3d *)&Phi_k,&this->orientation_);
  RPYToRotMat(&R_ItoB_hat,(Vector3d *)&Phi_k);
  matrix = &this->velocity_;
  local_1c38 = (StorageBaseType *)&this->gravity_;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&GQG,&dt_local,local_1c38);
  local_1c50 = (Matrix<double,_3,_1,_0,_3,_1> *)
               GQG.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data
               .array[2];
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[0] =
       (double)&R_ItoB_hat;
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[1] =
       (double)&a_est;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&Gk,(MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                      *)&Qd,&dt_local);
  Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[4] =
       (double)local_1c50;
  Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[5] =
       GQG.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array
       [3];
  Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[8] =
       Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[0]
  ;
  Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[9] =
       Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[1]
  ;
  Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[0xb]
       = Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array
         [3];
  Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[1] =
       (double)matrix;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
            (matrix,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                     *)&Phi_k);
  local_1c50 = &this->position_;
  local_1c30 = this;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&d_w_skew_d_biasGr,&dt_local,(StorageBaseType *)matrix);
  d_w_skew_d_biasGp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[3] = d_w_skew_d_biasGr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[2];
  d_w_skew_d_biasGp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[4] = d_w_skew_d_biasGr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[3];
  local_1c58 = (Matrix3d *)0x3fe0000000000000;
  d_w_skew_d_biasGp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[0] = (double)&this->position_;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_1be0,(double *)&local_1c58,local_1c38);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&Jr,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                      *)local_1be0,&dt_local);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&Qd,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                      *)&Jr,&dt_local);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator-((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
               *)&GQG,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                       *)&d_w_skew_d_biasGp,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
               *)&Qd);
  local_1c40 = (Matrix3d *)0x3fe0000000000000;
  local_1bf0 = &R_ItoB_hat;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)local_1c20,(double *)&local_1c40,(StorageBaseType *)&local_1bf0);
  d_w_skew_d_biasGq.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[2] = local_1c10.m_other;
  d_w_skew_d_biasGq.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[3] = (double)local_1c08.m_matrix;
  d_w_skew_d_biasGq.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[5] = (double)&a_est;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::Matrix<double,3,1,0,3,1>,0>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&R_pert,
              (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::Matrix<double,3,1,0,3,1>,0>>
               *)&d_w_skew_d_biasGq,&dt_local);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&Gk,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                      *)&R_pert,&dt_local);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
               *)&Phi_k,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
               *)&GQG,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                       *)&Gk);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
            (local_1c50,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&Phi_k);
  local_1c50 = (Matrix<double,_3,_1,_0,_3,_1> *)(angle_rate * dt_local);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  R_pert.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  R_pert.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  R_pert.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  R_pert.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  R_pert.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       1.0;
  R_pert.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  R_pert.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  R_pert.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  R_pert.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       1.0;
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Jr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  Jr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  Jr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  Jr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  Jr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
  Jr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  Jr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  Jr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  Jr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  if (1e-10 < (double)local_1c50) {
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&Phi_k,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&w_est,&angle_rate);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&d_w_skew_d_biasGq,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&Phi_k);
    local_1c20._0_8_ = cos((double)local_1c50);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      *)&d_w_skew_d_biasGp,(double *)local_1c20,(StorageBaseType *)&local_1bf0);
    dVar1 = cos((double)local_1c50);
    local_1c58 = (Matrix3d *)(1.0 - dVar1);
    local_1be0._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&d_w_skew_d_biasGq;
    local_1be0._8_8_ = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&d_w_skew_d_biasGq;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                      *)&Gk,(double *)&local_1c58,(StorageBaseType *)local_1be0);
    local_1c38 = (StorageBaseType *)
                 d_w_skew_d_biasGp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[2];
    local_1c28 = Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.
                 m_data.array[2];
    d_w_skew_d_biasGr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[0] = Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.
               array[3];
    d_w_skew_d_biasGr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[1] = Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.
               array[4];
    local_1c40 = (Matrix3d *)sin((double)local_1c50);
    SkewSymmetric((Matrix3d *)&GQG,(Vector3d *)&d_w_skew_d_biasGq);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                      *)&Qd,(double *)&local_1c40,(StorageBaseType *)&GQG);
    Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[4]
         = (double)local_1c38;
    Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[8]
         = local_1c28;
    Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[9]
         = d_w_skew_d_biasGr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[0];
    Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array
    [10] = d_w_skew_d_biasGr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[1];
    Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array
    [0xf] = Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.
            array[2];
    Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array
    [0x10] = Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.
             array[3];
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Product<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,0>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>>
              (&R_pert,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                        *)&Phi_k);
    dVar1 = sin((double)local_1c50);
    local_1c20._0_8_ = dVar1 / (double)local_1c50;
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      *)&d_w_skew_d_biasGp,(double *)local_1c20,(StorageBaseType *)&local_1bf0);
    dVar1 = sin((double)local_1c50);
    local_1c58 = (Matrix3d *)(1.0 - dVar1 / (double)local_1c50);
    local_1be0._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&d_w_skew_d_biasGq;
    local_1be0._8_8_ = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&d_w_skew_d_biasGq;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                      *)&Gk,(double *)&local_1c58,(StorageBaseType *)local_1be0);
    local_1c38 = (StorageBaseType *)
                 d_w_skew_d_biasGp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[2];
    local_1c28 = Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.
                 m_data.array[2];
    d_w_skew_d_biasGr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[0] = Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.
               array[3];
    d_w_skew_d_biasGr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[1] = Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.
               array[4];
    dVar1 = cos((double)local_1c50);
    local_1c40 = (Matrix3d *)((1.0 - dVar1) / (double)local_1c50);
    SkewSymmetric((Matrix3d *)&GQG,(Vector3d *)&d_w_skew_d_biasGq);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                      *)&Qd,(double *)&local_1c40,(StorageBaseType *)&GQG);
    Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[4]
         = (double)local_1c38;
    Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[8]
         = local_1c28;
    Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[9]
         = d_w_skew_d_biasGr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[0];
    Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array
    [10] = d_w_skew_d_biasGr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[1];
    Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array
    [0xf] = Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.
            array[2];
    Phi_k.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array
    [0x10] = Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.
             array[3];
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Product<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,0>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>>
              (&Jr,(CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&Phi_k);
  }
  Eigen::DenseBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,15,15,0,15,15>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,15,15,0,15,15>>>
            ((PlainObjectBase<Eigen::Matrix<double,15,15,0,15,15>> *)&Phi_k,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_15,_15,_0,_15,_15>_>_>
              *)&GQG);
  Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&GQG,&Phi_k,0,0,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::Matrix<double,3,3,0,3,3>>
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&GQG,&R_pert);
  local_1c20._0_8_ = -0.5;
  local_1c58 = &R_ItoB_hat;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&d_w_skew_d_biasGq,(double *)local_1c20,(StorageBaseType *)&local_1c58);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&d_w_skew_d_biasGr,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&a_est,&dt_local);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&Gk,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                      *)&d_w_skew_d_biasGr,&dt_local);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_1be0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&Gk);
  SkewSymmetric((Matrix3d *)&GQG,(Vector3d *)local_1be0);
  d_w_skew_d_biasGp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[2] = d_w_skew_d_biasGq.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[2];
  d_w_skew_d_biasGp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[3] = d_w_skew_d_biasGq.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[3];
  d_w_skew_d_biasGp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[5] = (double)&GQG;
  Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&Qd,&Phi_k,3,0,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&Qd,
             (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
              *)&d_w_skew_d_biasGp);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&Qd,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&a_est,&dt_local);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&d_w_skew_d_biasGq,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&Qd);
  SkewSymmetric((Matrix3d *)&GQG,(Vector3d *)&d_w_skew_d_biasGq);
  d_w_skew_d_biasGp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[0] = (double)&R_ItoB_hat;
  d_w_skew_d_biasGp.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[2] = (double)&GQG;
  Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&Gk,&Phi_k,6,0,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&Gk,
             (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
              *)&d_w_skew_d_biasGp);
  Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&GQG,&Phi_k,3,3,3,3);
  Eigen::internal::
  setIdentity_impl<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>,_false>::
  run((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&GQG);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&Gk,&dt_local,(StorageBaseType *)&Qd);
  Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&GQG,&Phi_k,3,6,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&GQG,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&Gk);
  Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&GQG,&Phi_k,6,6,3,3);
  Eigen::internal::
  setIdentity_impl<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>,_false>::
  run((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&GQG);
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[0] =
       (double)&R_pert;
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[2] =
       (double)&Jr;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)&GQG,(MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
                       *)&Qd,&dt_local);
  Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&Gk,&Phi_k,0,9,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&Gk,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&GQG);
  GQG.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[0] =
       -1.0;
  GQG.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[1] =
       0.0;
  GQG.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[2] =
       0.0;
  SkewSymmetric(&d_w_skew_d_biasGp,(Vector3d *)&GQG);
  local_1be0._0_8_ = (LhsNested)0xbfe0000000000000;
  local_1c20._0_8_ = &R_ItoB_hat;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)&d_w_skew_d_biasGr,(double *)local_1be0,(StorageBaseType *)local_1c20);
  pVVar3 = local_1bf8;
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[2] =
       d_w_skew_d_biasGr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
       m_data.array[2];
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[3] =
       d_w_skew_d_biasGr.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
       m_data.array[3];
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[5] =
       (double)&w_ss;
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[10] =
       (double)local_1bf8;
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[6] =
       (double)&d_w_skew_d_biasGp;
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[7] =
       (double)&d_w_skew_d_biasGp;
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[8] =
       Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[5]
  ;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&Gk,(MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                      *)&Qd,&dt_local);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&GQG,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                       *)&Gk,&dt_local);
  Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&d_w_skew_d_biasGq,
             &Phi_k,3,9,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&d_w_skew_d_biasGq,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&GQG);
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[0] =
       (double)&R_ItoB_hat;
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[2] =
       (double)&w_ss;
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[3] =
       (double)&d_w_skew_d_biasGp;
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[7] =
       (double)pVVar3;
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[4] =
       Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[3]
  ;
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[5] =
       Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[2]
  ;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&GQG,(MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                       *)&Gk,&dt_local);
  Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&Qd,&Phi_k,6,9,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&Qd,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&GQG);
  GQG.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[0] =
       0.0;
  GQG.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[1] =
       -1.0;
  GQG.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[2] =
       0.0;
  SkewSymmetric(&d_w_skew_d_biasGq,(Vector3d *)&GQG);
  local_1c20._0_8_ = -0.5;
  local_1c58 = &R_ItoB_hat;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)local_1be0,(double *)local_1c20,(StorageBaseType *)&local_1c58);
  pVVar3 = local_1bf8;
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[2] =
       (double)local_1bd0.m_matrix;
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[3] =
       (double)local_1bc8.m_matrix;
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[5] =
       (double)&w_ss;
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[10] =
       (double)local_1bf8;
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[6] =
       (double)&d_w_skew_d_biasGq;
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[7] =
       (double)&d_w_skew_d_biasGq;
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[8] =
       Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[5]
  ;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&Gk,(MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                      *)&Qd,&dt_local);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&GQG,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                       *)&Gk,&dt_local);
  Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&d_w_skew_d_biasGr,
             &Phi_k,3,10,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&d_w_skew_d_biasGr,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&GQG);
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[0] =
       (double)&R_ItoB_hat;
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[2] =
       (double)&w_ss;
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[3] =
       (double)&d_w_skew_d_biasGq;
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[7] =
       (double)pVVar3;
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[4] =
       Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[3]
  ;
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[5] =
       Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[2]
  ;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&GQG,(MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                       *)&Gk,&dt_local);
  Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&Qd,&Phi_k,6,10,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&Qd,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&GQG);
  GQG.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[0] =
       0.0;
  GQG.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[1] =
       0.0;
  GQG.super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.m_data.array[2] =
       -1.0;
  SkewSymmetric(&d_w_skew_d_biasGr,(Vector3d *)&GQG);
  local_1c58 = (Matrix3d *)0xbfe0000000000000;
  local_1c40 = &R_ItoB_hat;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)local_1c20,(double *)&local_1c58,(StorageBaseType *)&local_1c40);
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[2] =
       local_1c10.m_other;
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[3] =
       (double)local_1c08.m_matrix;
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[5] =
       (double)&w_ss;
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[10] =
       (double)pVVar3;
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[6] =
       (double)&d_w_skew_d_biasGr;
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[7] =
       (double)&d_w_skew_d_biasGr;
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[8] =
       Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[5]
  ;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&Gk,(MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                      *)&Qd,&dt_local);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&GQG,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                       *)&Gk,&dt_local);
  Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)local_1be0,&Phi_k,3,
             0xb,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)local_1be0,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&GQG);
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[0] =
       (double)&R_ItoB_hat;
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[2] =
       (double)&w_ss;
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[3] =
       (double)&d_w_skew_d_biasGr;
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[7] =
       (double)pVVar3;
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[4] =
       Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[3]
  ;
  Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[5] =
       Gk.super_PlainObjectBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>.m_storage.m_data.array[2]
  ;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&GQG,(MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                       *)&Gk,&dt_local);
  Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&Qd,&Phi_k,6,0xb,3,1)
  ;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&Qd,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&GQG);
  Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&GQG,&Phi_k,9,9,3,3);
  Eigen::internal::
  setIdentity_impl<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>,_false>::
  run((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&GQG);
  local_1c20._0_8_ = -0.5;
  local_1c58 = &R_ItoB_hat;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)local_1be0,(double *)local_1c20,(StorageBaseType *)&local_1c58);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
               *)&Gk,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>>
                      *)local_1be0,&dt_local);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
               *)&GQG,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                       *)&Gk,&dt_local);
  Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&Qd,&Phi_k,3,0xc,3,3)
  ;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&Qd,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
              *)&GQG);
  Qd.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array[0] =
       (double)&R_ItoB_hat;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
               *)&Gk,(MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>>
                      *)&Qd,&dt_local);
  Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&GQG,&Phi_k,6,0xc,3,3
            );
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&GQG,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
              *)&Gk);
  Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&GQG,&Phi_k,0xc,0xc,3
             ,3);
  Eigen::internal::
  setIdentity_impl<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>,_false>::
  run((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)&GQG);
  Eigen::DenseBase<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,15,12,0,15,12>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,15,12,0,15,12>>>
            ((PlainObjectBase<Eigen::Matrix<double,15,12,0,15,12>> *)&Gk,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_15,_12,_0,_15,_12>_>_>
              *)&GQG);
  local_1be0._0_8_ = &R_pert;
  local_1bd0.m_matrix = (non_const_type)&Jr;
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)&GQG,(MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
                       *)local_1be0,&dt_local);
  Eigen::Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,__1,__1,_false> *)&Qd,&Gk,0,0,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,15,12,0,15,12>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
            ((Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,__1,__1,_false> *)&Qd,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&GQG);
  local_1c58 = (Matrix3d *)0xbfe0000000000000;
  local_1c40 = &R_ItoB_hat;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)local_1c20,(double *)&local_1c58,(StorageBaseType *)&local_1c40);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
               *)&Qd,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>>
                      *)local_1c20,&dt_local);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
               *)&GQG,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                       *)&Qd,&dt_local);
  Eigen::Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,__1,__1,_false> *)local_1be0,&Gk,3,3,3,
             3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,15,12,0,15,12>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            ((Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,__1,__1,_false> *)local_1be0,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
              *)&GQG);
  local_1be0._0_8_ = &R_ItoB_hat;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
               *)&Qd,(MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>>
                      *)local_1be0,&dt_local);
  Eigen::Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,__1,__1,_false> *)&GQG,&Gk,6,3,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,15,12,0,15,12>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            ((Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,__1,__1,_false> *)&GQG,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
              *)&Qd);
  Eigen::Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,__1,__1,_false> *)&GQG,&Gk,9,6,3,3);
  Eigen::internal::
  setIdentity_impl<Eigen::Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,_-1,_-1,_false>,_false>::
  run((Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,__1,__1,_false> *)&GQG);
  Eigen::Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,__1,__1,_false> *)&GQG,&Gk,0xc,9,3,3);
  Eigen::internal::
  setIdentity_impl<Eigen::Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,_-1,_-1,_false>,_false>::
  run((Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,__1,__1,_false> *)&GQG);
  Eigen::DenseBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,12,0,12,12>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,12,12,0,12,12>>>
            ((PlainObjectBase<Eigen::Matrix<double,12,12,0,12,12>> *)&Qd,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_12,_12,_0,_12,_12>_>_>
              *)&GQG);
  pIVar2 = local_1c30;
  local_1c58 = (Matrix3d *)(local_1c30->gyro_noise * local_1c30->gyro_noise);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)local_1c20,(double *)&local_1c58,(StorageBaseType *)&local_1c40);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
  ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)&GQG,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
                       *)local_1c20,&dt_local);
  Eigen::Block<Eigen::Matrix<double,_12,_12,_0,_12,_12>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_12,_12,_0,_12,_12>,__1,__1,_false> *)local_1be0,&Qd,0,0,3,
             3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,0,12,12>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
            ((Block<Eigen::Matrix<double,_12,_12,_0,_12,_12>,__1,__1,_false> *)local_1be0,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&GQG);
  local_1c58 = (Matrix3d *)(pIVar2->accel_noise * pIVar2->accel_noise);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)local_1c20,(double *)&local_1c58,(StorageBaseType *)&local_1c40);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
  ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)&GQG,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
                       *)local_1c20,&dt_local);
  Eigen::Block<Eigen::Matrix<double,_12,_12,_0,_12,_12>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_12,_12,_0,_12,_12>,__1,__1,_false> *)local_1be0,&Qd,3,3,3,
             3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,0,12,12>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
            ((Block<Eigen::Matrix<double,_12,_12,_0,_12,_12>,__1,__1,_false> *)local_1be0,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&GQG);
  local_1c58 = (Matrix3d *)(pIVar2->gyro_rw * pIVar2->gyro_rw);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)local_1c20,(double *)&local_1c58,(StorageBaseType *)&local_1c40);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)&GQG,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
                       *)local_1c20,&dt_local);
  Eigen::Block<Eigen::Matrix<double,_12,_12,_0,_12,_12>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_12,_12,_0,_12,_12>,__1,__1,_false> *)local_1be0,&Qd,6,6,3,
             3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,0,12,12>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
            ((Block<Eigen::Matrix<double,_12,_12,_0,_12,_12>,__1,__1,_false> *)local_1be0,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&GQG);
  local_1c58 = (Matrix3d *)(pIVar2->accel_rw * pIVar2->accel_rw);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                    *)local_1c20,(double *)&local_1c58,(StorageBaseType *)&local_1c40);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)&GQG,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
                       *)local_1c20,&dt_local);
  Eigen::Block<Eigen::Matrix<double,_12,_12,_0,_12,_12>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<double,_12,_12,_0,_12,_12>,__1,__1,_false> *)local_1be0,&Qd,9,9,3,
             3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,12,0,12,12>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
            ((Block<Eigen::Matrix<double,_12,_12,_0,_12,_12>,__1,__1,_false> *)local_1be0,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&GQG);
  local_1be0._0_8_ = &Gk;
  local_1be0._8_8_ = (PlainObjectBase<Eigen::Matrix<double,12,12,0,12,12>> *)&Qd;
  local_1bd0.m_matrix = (non_const_type)local_1be0._0_8_;
  Eigen::PlainObjectBase<Eigen::Matrix<double,15,15,0,15,15>>::
  _set_noalias<Eigen::Product<Eigen::Product<Eigen::Matrix<double,15,12,0,15,12>,Eigen::Matrix<double,12,12,0,12,12>,0>,Eigen::Transpose<Eigen::Matrix<double,15,12,0,15,12>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,15,15,0,15,15>> *)&GQG,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_15,_12,_0,_15,_12>,_Eigen::Matrix<double,_12,_12,_0,_12,_12>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_15,_12,_0,_15,_12>_>,_0>_>
              *)local_1be0);
  local_1c58 = (Matrix3d *)0x3fe0000000000000;
  local_1c20._0_8_ =
       (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
        *)&GQG;
  local_1c20._8_8_ =
       (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
        *)&GQG;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_const_Eigen::Transpose<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>_>_>
                    *)local_1be0,(double *)&local_1c58,(StorageBaseType *)local_1c20);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,15,15,0,15,15>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,15,15,0,15,15>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,15,15,0,15,15>const,Eigen::Transpose<Eigen::Matrix<double,15,15,0,15,15>>const>const>>
            (&GQG,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_const_Eigen::Transpose<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>_>_>
                   *)local_1be0);
  this_00 = &pIVar2->P_;
  local_1be0._0_8_ = &Phi_k;
  local_1be0._8_8_ = this_00;
  local_1bd0.m_matrix = (non_const_type)local_1be0._0_8_;
  local_1bc8.m_matrix = (non_const_type)&GQG;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,15,15,0,15,15>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,15,15,0,15,15>,Eigen::Matrix<double,15,15,0,15,15>,0>,Eigen::Transpose<Eigen::Matrix<double,15,15,0,15,15>>,0>const,Eigen::Matrix<double,15,15,0,15,15>const>>
            (this_00,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_0>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>_>
                      *)local_1be0);
  for (row = 0; row != 0xf; row = row + 1) {
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_1> *)this_00,row,
                        row);
    if (*pSVar4 <= 0.0 && *pSVar4 != 0.0) {
      std::operator<<((ostream *)&std::cout,"WARNING: P is not PSD!\n");
    }
  }
  return;
}

Assistant:

void InsEkf::Predict(double dt) { // https://docs.openvins.com/propagation.html

        Eigen::Vector3d w_est = last_measurements_.segment(m_I(MI::p), 3) - bias_g_;
        Eigen::Vector3d a_est = last_measurements_.segment(m_I(MI::ax), 3) - bias_a_;

        // subtract the effect of rotating at offset from vehicle center
        a_est -= SkewSymmetric(w_est) * SkewSymmetric(w_est) * imu_offset_;

        Eigen::Matrix3d w_ss = SkewSymmetric(w_est);
        Eigen::Matrix4d omega = Eigen::Matrix4d::Zero();
        omega.block(0, 0, 3, 3) = -w_ss;
        omega.block(0, 3, 3, 1) = w_est;
        omega.block(3, 0, 1, 3) = -w_est.transpose();

        double angle_rate = w_est.norm();

        // Trawny et al, equation 103, p.12
        Eigen::Matrix4d theta = Eigen::Matrix4d::Identity() + 0.5 * dt * omega;
        if(angle_rate > 1e-10)
            theta = cos(0.5 * angle_rate * dt) * Eigen::Matrix4d::Identity() + (1.0 / angle_rate) * sin(0.5 * angle_rate * dt) * omega;

        // propagate orientation
        orientation_ = theta * orientation_;

        // propagate velocity and position
        Eigen::Matrix3d R_ItoB_hat = RPYToRotMat(QuatToRPY(orientation_)); // rotation matrix estimate from inertial to body frame
        velocity_ = velocity_ - dt * gravity_ + R_ItoB_hat.transpose() * a_est * dt;
        position_ = position_ + dt * velocity_ - 0.5 * gravity_ * dt * dt + 0.5 * R_ItoB_hat.transpose() * a_est * dt * dt;

        // propagate covariance
        double angle = angle_rate * dt;

        // exponential map
        Eigen::Matrix3d R_pert = Eigen::Matrix3d::Identity();
        // SO3 right jacobian
        Eigen::Matrix3d Jr = Eigen::Matrix3d::Identity();

        if(angle > 1e-10){
            Eigen::Vector3d rate_vect = w_est / angle_rate; // normalize

            // Barfoot, equation 6.56, p. 189
            R_pert = cos(angle) * Eigen::Matrix3d::Identity() + (1.0 - cos(angle)) * (rate_vect * rate_vect.transpose()) +
                                     sin(angle) * SkewSymmetric(rate_vect);

            // Barfoot, equation 7.77a, p. 233
            Jr = (sin(angle) / angle) * Eigen::Matrix3d::Identity() + (1.0 - sin(angle) / angle) * (rate_vect * rate_vect.transpose()) -
                 ((1.0 - cos(angle))/angle) * SkewSymmetric(rate_vect);
        }

        Eigen::Matrix<double, s_I(SI::NUM_STATES), s_I(SI::NUM_STATES)> Phi_k = Eigen::Matrix<double, s_I(SI::NUM_STATES), s_I(SI::NUM_STATES)>::Zero();
        Phi_k.block(s_I(SI::roll), s_I(SI::roll), 3, 3) = R_pert;
        Phi_k.block(s_I(SI::x), s_I(SI::roll), 3, 3) = -0.5 * R_ItoB_hat.transpose() * SkewSymmetric(a_est * dt * dt);
        Phi_k.block(s_I(SI::Vx), s_I(SI::roll), 3, 3) = -R_ItoB_hat.transpose() * SkewSymmetric(a_est * dt);

        Phi_k.block(s_I(SI::x), s_I(SI::x), 3, 3).setIdentity();

        Phi_k.block(s_I(SI::x), s_I(SI::Vx), 3, 3) = dt * Eigen::Matrix3d::Identity();
        Phi_k.block(s_I(SI::Vx), s_I(SI::Vx), 3, 3).setIdentity();

        Phi_k.block(s_I(SI::roll), s_I(SI::biasGp), 3, 3) = -R_pert * Jr * dt;
        Eigen::Matrix3d d_w_skew_d_biasGp = SkewSymmetric(Eigen::Vector3d{-1.0, 0.0, 0.0});
        Phi_k.block(s_I(SI::x), s_I(SI::biasGp), 3, 1) = -0.5 * R_ItoB_hat.transpose() * (w_ss*d_w_skew_d_biasGp + d_w_skew_d_biasGp*w_ss) * imu_offset_ * dt * dt;
        Phi_k.block(s_I(SI::Vx), s_I(SI::biasGp), 3, 1) = -R_ItoB_hat.transpose() * (w_ss*d_w_skew_d_biasGp + d_w_skew_d_biasGp*w_ss) * imu_offset_ * dt;
        Eigen::Matrix3d d_w_skew_d_biasGq = SkewSymmetric(Eigen::Vector3d{0.0, -1.0, 0.0});
        Phi_k.block(s_I(SI::x), s_I(SI::biasGq), 3, 1) = -0.5 * R_ItoB_hat.transpose() * (w_ss*d_w_skew_d_biasGq + d_w_skew_d_biasGq*w_ss) * imu_offset_ * dt * dt;
        Phi_k.block(s_I(SI::Vx), s_I(SI::biasGq), 3, 1) = -R_ItoB_hat.transpose() * (w_ss*d_w_skew_d_biasGq + d_w_skew_d_biasGq*w_ss) * imu_offset_ * dt;
        Eigen::Matrix3d d_w_skew_d_biasGr = SkewSymmetric(Eigen::Vector3d{0.0, 0.0, -1.0});
        Phi_k.block(s_I(SI::x), s_I(SI::biasGr), 3, 1) = -0.5 * R_ItoB_hat.transpose() * (w_ss*d_w_skew_d_biasGr + d_w_skew_d_biasGr*w_ss) * imu_offset_ * dt * dt;
        Phi_k.block(s_I(SI::Vx), s_I(SI::biasGr), 3, 1) = -R_ItoB_hat.transpose() * (w_ss*d_w_skew_d_biasGr + d_w_skew_d_biasGr*w_ss) * imu_offset_ * dt;
        Phi_k.block(s_I(SI::biasGp), s_I(SI::biasGp), 3, 3).setIdentity();

        Phi_k.block(s_I(SI::x), s_I(SI::biasAx), 3, 3) = -0.5 * R_ItoB_hat.transpose() * dt * dt;
        Phi_k.block(s_I(SI::Vx), s_I(SI::biasAx), 3, 3) = -R_ItoB_hat.transpose() * dt;
        Phi_k.block(s_I(SI::biasAx), s_I(SI::biasAx), 3, 3).setIdentity();


        Eigen::Matrix<double, s_I(SI::NUM_STATES), 12> Gk = Eigen::Matrix<double, s_I(SI::NUM_STATES), 12>::Zero();
        Gk.block(s_I(SI::roll), m_I(MI::p), 3, 3) = -R_pert * Jr * dt;
        Gk.block(s_I(SI::x), m_I(MI::ax), 3, 3) = -0.5 * R_ItoB_hat.transpose() * dt * dt;
        Gk.block(s_I(SI::Vx), m_I(MI::ax), 3 ,3) = -R_ItoB_hat.transpose() * dt;
        Gk.block(s_I(SI::biasGp), m_I(MI::p) + 6, 3, 3).setIdentity();
        Gk.block(s_I(SI::biasAx), m_I(MI::ax) + 6, 3, 3).setIdentity();

        Eigen::Matrix<double, 12, 12> Qd = Eigen::Matrix<double, 12, 12>::Zero();
        Qd.block(m_I(MI::p), m_I(MI::p), 3, 3) = pow(gyro_noise, 2) * Eigen::Matrix3d::Identity() / dt;
        Qd.block(m_I(MI::ax), m_I(MI::ax), 3, 3) = pow(accel_noise, 2) * Eigen::Matrix3d::Identity() / dt;
        Qd.block(m_I(MI::p) + 6, m_I(MI::p) + 6, 3, 3) = pow(gyro_rw, 2) * Eigen::Matrix3d::Identity() * dt;
        Qd.block(m_I(MI::ax) + 6, m_I(MI::ax) + 6, 3, 3) = pow(accel_rw, 2) * Eigen::Matrix3d::Identity() * dt;

        Eigen::Matrix<double, 15, 15> GQG = Gk * Qd * Gk.transpose();
        GQG = 0.5 * (GQG + GQG.transpose());

        P_ = Phi_k * P_ * Phi_k.transpose() + GQG;

        for(auto i = 0; i < P_.cols(); ++i){
            if(P_(i, i) < 0.0)
                std::cout<<"WARNING: P is not PSD!\n";
        }
    }